

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Graph<Node>::royFloyd(Graph<Node> *this)

{
  int iVar1;
  int iVar2;
  vector<vector<int>_> *pvVar3;
  vector<int> *pvVar4;
  int *piVar5;
  int local_ac;
  int local_a8;
  int j_3;
  int i_4;
  int local_9c;
  int local_98;
  int kNotAdded;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int kAdded;
  int j_2;
  int i_3;
  int k;
  int local_70 [3];
  int local_64;
  int cost;
  int dest;
  int source;
  Edge currEdge;
  int i_2;
  int local_44;
  int local_40;
  int j_1;
  int i_1;
  int j;
  int i;
  undefined1 local_28 [8];
  vector<vector<vector<int>_>_> dp;
  int Inf;
  Graph<Node> *this_local;
  
  dp._capacity = 0x3f3f3f3f;
  vector<vector<vector<int>_>_>::vector((vector<vector<vector<int>_>_> *)local_28);
  vector<vector<vector<int>_>_>::resize((vector<vector<vector<int>_>_> *)local_28,this->_nodeCnt);
  for (i_1 = 0; i_1 < this->_nodeCnt; i_1 = i_1 + 1) {
    pvVar3 = vector<vector<vector<int>_>_>::operator[]
                       ((vector<vector<vector<int>_>_> *)local_28,&i_1);
    vector<vector<int>_>::resize(pvVar3,this->_nodeCnt);
    for (j_1 = 0; j_1 < this->_nodeCnt; j_1 = j_1 + 1) {
      pvVar3 = vector<vector<vector<int>_>_>::operator[]
                         ((vector<vector<vector<int>_>_> *)local_28,&i_1);
      pvVar4 = vector<vector<int>_>::operator[](pvVar3,&j_1);
      vector<int>::resize(pvVar4,this->_nodeCnt);
    }
  }
  for (local_40 = 0; local_40 < this->_nodeCnt; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < this->_nodeCnt; local_44 = local_44 + 1) {
      if (local_40 == local_44) {
        pvVar3 = vector<vector<vector<int>_>_>::operator[]
                           ((vector<vector<vector<int>_>_> *)local_28,&local_40);
        pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_44);
        i_2 = 0;
        piVar5 = vector<int>::operator[](pvVar4,&i_2);
        *piVar5 = 0;
      }
      else {
        pvVar3 = vector<vector<vector<int>_>_>::operator[]
                           ((vector<vector<vector<int>_>_> *)local_28,&local_40);
        pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_44);
        currEdge._cost = 0;
        piVar5 = vector<int>::operator[](pvVar4,&currEdge._cost);
        *piVar5 = 0x3f3f3f3f;
      }
    }
  }
  currEdge._nodeD = 0;
  while( true ) {
    iVar2 = currEdge._nodeD;
    iVar1 = vector<Edge>::size(&this->edges);
    if (iVar1 <= iVar2) break;
    getEdge((Graph<Node> *)&dest,&this->_nodeCnt);
    cost = Edge::getSource((Edge *)&dest);
    local_64 = Edge::getDest((Edge *)&dest);
    local_70[2] = Edge::getCost((Edge *)&dest);
    pvVar3 = vector<vector<vector<int>_>_>::operator[]
                       ((vector<vector<vector<int>_>_> *)local_28,&cost);
    pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_64);
    local_70[1] = 0;
    piVar5 = vector<int>::operator[](pvVar4,local_70 + 1);
    iVar2 = min<int>(piVar5,local_70 + 2);
    pvVar3 = vector<vector<vector<int>_>_>::operator[]
                       ((vector<vector<vector<int>_>_> *)local_28,&cost);
    pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_64);
    local_70[0] = 0;
    piVar5 = vector<int>::operator[](pvVar4,local_70);
    *piVar5 = iVar2;
    pvVar3 = vector<vector<vector<int>_>_>::operator[]
                       ((vector<vector<vector<int>_>_> *)local_28,&local_64);
    pvVar4 = vector<vector<int>_>::operator[](pvVar3,&cost);
    k = 0;
    piVar5 = vector<int>::operator[](pvVar4,&k);
    iVar1 = min<int>(piVar5,local_70 + 2);
    pvVar3 = vector<vector<vector<int>_>_>::operator[]
                       ((vector<vector<vector<int>_>_> *)local_28,&local_64);
    pvVar4 = vector<vector<int>_>::operator[](pvVar3,&cost);
    i_3 = 0;
    piVar5 = vector<int>::operator[](pvVar4,&i_3);
    iVar2 = local_64;
    *piVar5 = iVar1;
    pvVar4 = vector<vector<int>_>::operator[](&this->nextNodeInPath,&cost);
    piVar5 = vector<int>::operator[](pvVar4,&local_64);
    iVar1 = cost;
    *piVar5 = iVar2;
    pvVar4 = vector<vector<int>_>::operator[](&this->nextNodeInPath,&local_64);
    piVar5 = vector<int>::operator[](pvVar4,&cost);
    *piVar5 = iVar1;
    Edge::~Edge((Edge *)&dest);
    currEdge._nodeD = currEdge._nodeD + 1;
  }
  for (j_2 = 1; j_2 <= this->_nodeCnt; j_2 = j_2 + 1) {
    for (kAdded = 0; kAdded < this->_nodeCnt; kAdded = kAdded + 1) {
      for (local_84 = 0; local_84 < this->_nodeCnt; local_84 = local_84 + 1) {
        pvVar3 = vector<vector<vector<int>_>_>::operator[]
                           ((vector<vector<vector<int>_>_> *)local_28,&kAdded);
        local_8c = j_2 + -1;
        pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_8c);
        local_90 = j_2 + -1;
        piVar5 = vector<int>::operator[](pvVar4,&local_90);
        iVar2 = *piVar5;
        kNotAdded = j_2 + -1;
        pvVar3 = vector<vector<vector<int>_>_>::operator[]
                           ((vector<vector<vector<int>_>_> *)local_28,&kNotAdded);
        pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_84);
        local_98 = j_2 + -1;
        piVar5 = vector<int>::operator[](pvVar4,&local_98);
        local_88 = iVar2 + *piVar5;
        pvVar3 = vector<vector<vector<int>_>_>::operator[]
                           ((vector<vector<vector<int>_>_> *)local_28,&kAdded);
        pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_84);
        i_4 = j_2 + -1;
        piVar5 = vector<int>::operator[](pvVar4,&i_4);
        iVar1 = local_88;
        iVar2 = *piVar5;
        local_9c = iVar2;
        if (local_88 < iVar2) {
          pvVar3 = vector<vector<vector<int>_>_>::operator[]
                             ((vector<vector<vector<int>_>_> *)local_28,&kAdded);
          pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_84);
          piVar5 = vector<int>::operator[](pvVar4,&j_2);
          *piVar5 = iVar1;
          pvVar4 = vector<vector<int>_>::operator[](&this->nextNodeInPath,&kAdded);
          j_3 = j_2 + -1;
          piVar5 = vector<int>::operator[](pvVar4,&j_3);
          iVar2 = *piVar5;
          pvVar4 = vector<vector<int>_>::operator[](&this->nextNodeInPath,&kAdded);
          piVar5 = vector<int>::operator[](pvVar4,&local_84);
          *piVar5 = iVar2;
        }
        else {
          pvVar3 = vector<vector<vector<int>_>_>::operator[]
                             ((vector<vector<vector<int>_>_> *)local_28,&kAdded);
          pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_84);
          piVar5 = vector<int>::operator[](pvVar4,&j_2);
          *piVar5 = iVar2;
        }
      }
    }
  }
  for (local_a8 = 0; local_a8 < this->_nodeCnt; local_a8 = local_a8 + 1) {
    for (local_ac = 0; local_ac < this->_nodeCnt; local_ac = local_ac + 1) {
      pvVar3 = vector<vector<vector<int>_>_>::operator[]
                         ((vector<vector<vector<int>_>_> *)local_28,&local_a8);
      pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_ac);
      piVar5 = vector<int>::operator[](pvVar4,&this->_nodeCnt);
      if (*piVar5 == 0x3f3f3f3f) {
        pvVar4 = vector<vector<int>_>::operator[](&this->minDist,&local_a8);
        piVar5 = vector<int>::operator[](pvVar4,&local_ac);
        *piVar5 = -1;
      }
      else {
        pvVar3 = vector<vector<vector<int>_>_>::operator[]
                           ((vector<vector<vector<int>_>_> *)local_28,&local_a8);
        pvVar4 = vector<vector<int>_>::operator[](pvVar3,&local_ac);
        piVar5 = vector<int>::operator[](pvVar4,&this->_nodeCnt);
        iVar2 = *piVar5;
        pvVar4 = vector<vector<int>_>::operator[](&this->minDist,&local_a8);
        piVar5 = vector<int>::operator[](pvVar4,&local_ac);
        *piVar5 = iVar2;
      }
    }
  }
  vector<vector<vector<int>_>_>::~vector((vector<vector<vector<int>_>_> *)local_28);
  return;
}

Assistant:

void royFloyd() {
        const int Inf = 0x3f3f3f3f;

        //make dp
        vector<vector<vector<int>>> dp;
        dp.resize(_nodeCnt);
        for (int i = 0; i < _nodeCnt; ++i) {
            dp[i].resize(_nodeCnt);
            for (int j = 0; j < _nodeCnt; ++j) {
                dp[i][j].resize(_nodeCnt);
            }
        }

        //initialize dp
        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                if (i == j) {
                    dp[i][j][0] = 0;
                }
                else {
                    dp[i][j][0] = Inf;
                }
            }
        }

        for (int i = 0; i < edges.size(); ++i) {
            Edge currEdge = getEdge(i);
            int source = currEdge.getSource();
            int dest = currEdge.getDest();
            int cost = currEdge.getCost();

            dp[source][dest][0] = min(dp[source][dest][0], cost);
            dp[dest][source][0] = min(dp[dest][source][0], cost);

            nextNodeInPath[source][dest] = dest;
            nextNodeInPath[dest][source] = source;
        }

        //calc dp (nodes added from 0 to k - 1 (+1) ||| 0 means no nodes added)
        for (int k = 1; k <= _nodeCnt; ++k) {
            for (int i = 0; i < _nodeCnt; ++i) {
                for (int j = 0; j < _nodeCnt; ++j) {
                    int kAdded = dp[i][k - 1][k - 1] + dp[k - 1][j][k - 1];
                    int kNotAdded = dp[i][j][k - 1];
                    if (kAdded < kNotAdded) {
                        dp[i][j][k] = kAdded;
                        nextNodeInPath[i][j] = nextNodeInPath[i][k - 1];
                    }
                    else {
                        dp[i][j][k] = kNotAdded;
                    }
                }
            }
        }

        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                if (dp[i][j][_nodeCnt] == Inf) {
                    minDist[i][j] = -1;
                }
                else {
                    minDist[i][j] = dp[i][j][_nodeCnt];
                }
            }
        }
    }